

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgztexture.cpp
# Opt level: O0

FTexture * IMGZTexture_TryCreate(FileReader *file,int lumpnum)

{
  int iVar1;
  undefined4 extraout_var;
  FileReader *pFVar2;
  FIMGZTexture *this;
  SWORD local_28;
  SWORD local_26;
  WORD local_24;
  WORD local_22;
  SWORD t;
  SWORD l;
  WORD h;
  WORD w;
  DWORD magic;
  int lumpnum_local;
  FileReader *file_local;
  
  _t = 0;
  _h = lumpnum;
  _magic = file;
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  iVar1 = (*(_magic->super_FileReaderBase)._vptr_FileReaderBase[2])(_magic,&t,4);
  if (CONCAT44(extraout_var,iVar1) == 4) {
    if (_t == 0x5a474d49) {
      pFVar2 = FileReader::operator>>(_magic,&local_22);
      pFVar2 = FileReader::operator>>(pFVar2,&local_24);
      pFVar2 = FileReader::operator>>(pFVar2,&local_26);
      FileReader::operator>>(pFVar2,&local_28);
      this = (FIMGZTexture *)operator_new(0xa8);
      FIMGZTexture::FIMGZTexture(this,_h,local_22,local_24,local_26,local_28);
      file_local = (FileReader *)this;
    }
    else {
      file_local = (FileReader *)0x0;
    }
  }
  else {
    file_local = (FileReader *)0x0;
  }
  return (FTexture *)file_local;
}

Assistant:

FTexture *IMGZTexture_TryCreate(FileReader & file, int lumpnum)
{
	DWORD magic = 0;
	WORD w, h;
	SWORD l, t;

	file.Seek(0, SEEK_SET);
	if (file.Read(&magic, 4) != 4) return NULL;
	if (magic != MAKE_ID('I','M','G','Z')) return NULL;
	file >> w >> h >> l >> t;
	return new FIMGZTexture(lumpnum, w, h, l, t);
}